

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotificationDispatcher.cpp
# Opt level: O0

shared_ptr<Notification> __thiscall
NotificationDispatcher::Find(NotificationDispatcher *this,uint32_t hNotify)

{
  bool bVar1;
  pointer ppVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  shared_ptr<Notification> sVar4;
  _Self local_48 [3];
  _Self local_30;
  iterator it;
  lock_guard<std::recursive_mutex> lock;
  uint32_t hNotify_local;
  NotificationDispatcher *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,hNotify);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&it,(mutex_type *)(lVar3 + 0x70));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::shared_ptr<Notification>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>_>
       ::find((map<unsigned_int,_std::shared_ptr<Notification>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>_>
               *)(lVar3 + 0x40),(key_type *)((long)&lock._M_device + 4));
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::shared_ptr<Notification>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>_>
       ::end((map<unsigned_int,_std::shared_ptr<Notification>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>_>
              *)(lVar3 + 0x40));
  bVar1 = std::operator!=(&local_30,local_48);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>
             ::operator->(&local_30);
    std::shared_ptr<Notification>::shared_ptr((shared_ptr<Notification> *)this,&ppVar2->second);
  }
  else {
    std::shared_ptr<Notification>::shared_ptr((shared_ptr<Notification> *)this);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&it);
  sVar4.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Notification>)
         sVar4.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Notification> NotificationDispatcher::Find(uint32_t hNotify)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    auto it = notifications.find(hNotify);
    if (it != notifications.end()) {
        return it->second;
    }
    return {};
}